

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O2

void GetArgumentRegisters
               (ExpressionContext *ctx,RegVmLoweredFunction *lowFunction,RegVmLoweredBlock *lowBlock
               ,SmallArray<unsigned_char,_32U> *result,VmValue *value)

{
  VmFunction *function;
  uchar targetReg;
  
  if (value != (VmValue *)0x0) {
    if (value->typeID == 4) {
      targetReg = RegVmLoweredFunction::GetRegisterForConstant(lowFunction);
      RegVmLoweredBlock::AddInstruction
                (lowBlock,ctx,value->source,rviFuncAddr,targetReg,'\0','\0',
                 *(uint *)((long)value[1]._vptr_VmValue + 0x44));
      SmallArray<unsigned_char,_32U>::push_back(result,&targetReg);
      return;
    }
    if (value->typeID == 1) {
      LowerConstantIntoBlock(ctx,lowFunction,lowBlock,result,value);
      return;
    }
  }
  RegVmLoweredFunction::GetRegisters(lowFunction,result,value);
  return;
}

Assistant:

void GetArgumentRegisters(ExpressionContext &ctx, RegVmLoweredFunction *lowFunction, RegVmLoweredBlock *lowBlock, SmallArray<unsigned char, 32> &result, VmValue *value)
{
	if(isType<VmConstant>(value))
	{
		LowerConstantIntoBlock(ctx, lowFunction, lowBlock, result, value);

		return;
	}

	if(VmFunction *function = getType<VmFunction>(value))
	{
		unsigned char targetReg = lowFunction->GetRegisterForConstant();

		lowBlock->AddInstruction(ctx, function->source, rviFuncAddr, targetReg, 0, 0, function->function->functionIndex);

		result.push_back(targetReg);

		return;
	}

	lowFunction->GetRegisters(result, value);
}